

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O1

bool __thiscall OpenMD::RNEMD::RNEMDParameters::requiresElectricField(RNEMDParameters *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  string token;
  StringTokenizer tokenizer;
  string local_c8;
  string local_a8;
  StringTokenizer local_88;
  
  if (requiresElectricField()::wasParsed == '\0') {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar1 = (this->OutputFields).data_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + (this->OutputFields).data_._M_string_length);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8," ,;|\t\n\r","");
    StringTokenizer::StringTokenizer(&local_88,&local_c8,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    do {
      bVar2 = StringTokenizer::hasMoreTokens(&local_88);
      if (!bVar2) break;
      StringTokenizer::nextToken_abi_cxx11_(&local_c8,&local_88);
      std::locale::locale((locale *)&local_a8);
      toUpper<std::__cxx11::string>(&local_c8,(locale *)&local_a8);
      std::locale::~locale((locale *)&local_a8);
      iVar3 = std::__cxx11::string::compare((char *)&local_c8);
      if (iVar3 == 0) {
LAB_0022ab15:
        this->calculateElectricField_ = true;
        bVar2 = false;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_c8);
        bVar2 = true;
        if (iVar3 == 0) goto LAB_0022ab15;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    } while (bVar2);
    requiresElectricField()::wasParsed = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
      operator_delete(local_88.delim_._M_dataplus._M_p,
                      local_88.delim_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
      operator_delete(local_88.tokenString_._M_dataplus._M_p,
                      local_88.tokenString_.field_2._M_allocated_capacity + 1);
    }
  }
  return this->calculateElectricField_;
}

Assistant:

bool RNEMDParameters::requiresElectricField() {
    static bool wasParsed {false};

    if (!wasParsed) {
      StringTokenizer tokenizer(getOutputFields(), " ,;|\t\n\r");

      while (tokenizer.hasMoreTokens()) {
        std::string token(tokenizer.nextToken());
        toUpper(token);

        if (token == "ELECTRICFIELD" || token == "ELECTROSTATICPOTENTIAL") {
          calculateElectricField_ = true;
          break;
        }
      }

      wasParsed = true;
    }

    return calculateElectricField_;
  }